

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O0

RatiotestResult
ratiotest_textbook(Runtime *rt,QpVector *p,QpVector *rowmove,Instance *instance,double alphastart)

{
  int iVar1;
  RatiotestResult RVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  long in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double alpha_i_1;
  HighsInt i_1;
  HighsInt j_1;
  double alpha_i;
  HighsInt i;
  HighsInt j;
  RatiotestResult result;
  double in_stack_ffffffffffffff88;
  value_type t;
  value_type in_stack_ffffffffffffff90;
  value_type in_stack_ffffffffffffff98;
  value_type in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  int local_4c;
  int local_3c;
  double local_10;
  int local_8;
  undefined4 uStack_4;
  
  local_8 = -1;
  local_10 = in_XMM0_Qa;
  for (local_3c = 0; local_3c < *in_RSI; local_3c = local_3c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_3c);
    iVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x900),(long)iVar1);
    in_stack_ffffffffffffff90 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)iVar1);
    in_stack_ffffffffffffff98 = *pvVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x1d0),(long)iVar1);
    in_stack_ffffffffffffffa0 = *pvVar4;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x1e8),(long)iVar1);
    dVar6 = step(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (dVar6 < local_10) {
      local_8 = *(int *)(in_RCX + 8) + iVar1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)iVar1);
      uStack_4 = CONCAT31(uStack_4._1_3_,*pvVar5 <= 0.0 && *pvVar5 != 0.0);
      local_10 = dVar6;
    }
  }
  for (local_4c = 0; local_4c < *in_RDX; local_4c = local_4c + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 2),(long)local_4c);
    iVar1 = *pvVar3;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x938),(long)iVar1);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),(long)iVar1);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RCX + 0xf8),(long)iVar1);
    t = *pvVar4;
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x110),(long)iVar1);
    dVar6 = step(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,t);
    in_stack_ffffffffffffffa8 = dVar6;
    if (dVar6 < local_10) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),(long)iVar1);
      uStack_4 = CONCAT31(uStack_4._1_3_,*pvVar5 <= 0.0 && *pvVar5 != 0.0);
      local_10 = dVar6;
      local_8 = iVar1;
    }
  }
  RVar2.limitingconstraint = local_8;
  RVar2.alpha = local_10;
  RVar2._12_4_ = uStack_4;
  return RVar2;
}

Assistant:

static RatiotestResult ratiotest_textbook(Runtime& rt, const QpVector& p,
                                          const QpVector& rowmove,
                                          Instance& instance,
                                          const double alphastart) {
  RatiotestResult result;
  result.limitingconstraint = -1;
  result.alpha = alphastart;

  // check ratio towards variable bounds
  for (HighsInt j = 0; j < p.num_nz; j++) {
    HighsInt i = p.index[j];
    double alpha_i = step(rt.primal.value[i], p.value[i], instance.var_lo[i],
                          instance.var_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = instance.num_con + i;
      result.nowactiveatlower = p.value[i] < 0;
    }
  }

  // check ratio towards constraint bounds
  for (HighsInt j = 0; j < rowmove.num_nz; j++) {
    HighsInt i = rowmove.index[j];
    double alpha_i =
        step(rt.rowactivity.value[i], rowmove.value[i], instance.con_lo[i],
             instance.con_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = i;
      result.nowactiveatlower = rowmove.value[i] < 0;
    }
  }

  return result;
}